

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeIndent(StyledWriter *this)

{
  ulong uVar1;
  char *pcVar2;
  long in_RDI;
  char last;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::length();
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
    if (*pcVar2 == ' ') {
      return;
    }
    if (*pcVar2 != '\n') {
      std::__cxx11::string::operator+=((string *)(in_RDI + 0x20),'\n');
    }
  }
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x20),(string *)(in_RDI + 0x40));
  return;
}

Assistant:

void StyledWriter::writeIndent() {
  if (!document_.empty()) {
    char last = document_[document_.length() - 1];
    if (last == ' ') // already indented
      return;
    if (last != '\n') // Comments may add new-line
      document_ += '\n';
  }
  document_ += indentString_;
}